

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# commissioner_safe.cpp
# Opt level: O1

void __thiscall
ot::commissioner::CommissionerSafe::
SetActiveDataset(std::function<void(ot::commissioner::Error)>,ot::commissioner::ActiveOperationalDataset_const&)
::$_0::~__0(__0 *this)

{
  if (*(void **)(this + 0xe0) != (void *)0x0) {
    operator_delete(*(void **)(this + 0xe0));
  }
  if (*(void **)(this + 0xc0) != (void *)0x0) {
    operator_delete(*(void **)(this + 0xc0));
  }
  if (*(void **)(this + 0xa8) != (void *)0x0) {
    operator_delete(*(void **)(this + 0xa8));
  }
  if (*(void **)(this + 0x90) != (void *)0x0) {
    operator_delete(*(void **)(this + 0x90));
  }
  std::
  vector<ot::commissioner::ChannelMaskEntry,_std::allocator<ot::commissioner::ChannelMaskEntry>_>::
  ~vector((vector<ot::commissioner::ChannelMaskEntry,_std::allocator<ot::commissioner::ChannelMaskEntry>_>
           *)(this + 0x78));
  if (*(__0 **)(this + 0x50) != this + 0x60) {
    operator_delete(*(__0 **)(this + 0x50));
  }
  if (*(void **)(this + 0x30) != (void *)0x0) {
    operator_delete(*(void **)(this + 0x30));
  }
  if (*(code **)(this + 0x18) != (code *)0x0) {
    (**(code **)(this + 0x18))(this + 8,this + 8,3);
  }
  return;
}

Assistant:

Error CommissionerSafe::SetActiveDataset(const ActiveOperationalDataset &aDataset)
{
    std::promise<Error> pro;
    auto                wait = [&pro](Error aError) { pro.set_value(aError); };

    SetActiveDataset(wait, aDataset);
    return pro.get_future().get();
}